

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

int64_t __thiscall
google::protobuf::io::CodedInputStream::ReadVarint32Fallback
          (CodedInputStream *this,uint32_t first_byte_or_zero)

{
  byte *pbVar1;
  ulong uVar2;
  Nonnull<const_char_*> pcVar3;
  byte *pbVar4;
  uint uVar5;
  int iVar6;
  pair<unsigned_long,_bool> pVar7;
  LogMessage local_20;
  
  pbVar4 = this->buffer_;
  pbVar1 = this->buffer_end_;
  if (((int)pbVar1 - (int)pbVar4 < 10) && ((pbVar1 <= pbVar4 || ((char)pbVar1[-1] < '\0')))) {
    pVar7 = ReadVarint64Fallback(this);
    uVar2 = 0xffffffffffffffff;
    if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar2 = (ulong)(uint)pVar7.first;
    }
    return uVar2;
  }
  if (first_byte_or_zero == 0) {
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (0,0,"first_byte_or_zero != 0");
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x207,pcVar3);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&local_20,
               (char (*) [64])"Caller should provide us with *buffer_ when buffer is non-empty");
  }
  else {
    if (*pbVar4 == first_byte_or_zero) {
      if ((char)first_byte_or_zero < '\0') {
        uVar5 = ((uint)pbVar4[1] * 0x80 + first_byte_or_zero) - 0x80;
        if ((char)pbVar4[1] < '\0') {
          uVar5 = (uVar5 + (uint)pbVar4[2] * 0x4000) - 0x4000;
          if ((char)pbVar4[2] < '\0') {
            uVar5 = (uVar5 + (uint)pbVar4[3] * 0x200000) - 0x200000;
            if ((char)pbVar4[3] < '\0') {
              uVar5 = uVar5 + (uint)pbVar4[4] * 0x10000000 + 0xf0000000;
              if ((char)pbVar4[4] < '\0') {
                pbVar4 = pbVar4 + 6;
                iVar6 = 5;
                while ((char)pbVar4[-1] < '\0') {
                  pbVar4 = pbVar4 + 1;
                  iVar6 = iVar6 + -1;
                  if (iVar6 == 0) {
                    return -1;
                  }
                }
              }
              else {
                pbVar4 = pbVar4 + 5;
              }
            }
            else {
              pbVar4 = pbVar4 + 4;
            }
          }
          else {
            pbVar4 = pbVar4 + 3;
          }
        }
        else {
          pbVar4 = pbVar4 + 2;
        }
        this->buffer_ = pbVar4;
        return (ulong)uVar5;
      }
    }
    else {
      ReadVarint32Fallback();
    }
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (0,0x80,"first_byte & 0x80 == 0x80");
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x1af,pcVar3);
    absl::lts_20250127::log_internal::LogMessage::operator<<(&local_20,first_byte_or_zero);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_20);
}

Assistant:

int64_t CodedInputStream::ReadVarint32Fallback(uint32_t first_byte_or_zero) {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    ABSL_DCHECK_NE(first_byte_or_zero, 0)
        << "Caller should provide us with *buffer_ when buffer is non-empty";
    uint32_t temp;
    ::std::pair<bool, const uint8_t*> p =
        ReadVarint32FromArray(first_byte_or_zero, buffer_, &temp);
    if (!p.first) return -1;
    buffer_ = p.second;
    return temp;
  } else {
    // Really slow case: we will incur the cost of an extra function call here,
    // but moving this out of line reduces the size of this function, which
    // improves the common case. In micro benchmarks, this is worth about 10-15%
    uint32_t temp;
    return ReadVarint32Slow(&temp) ? static_cast<int64_t>(temp) : -1;
  }
}